

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve_copy_sse2.c
# Opt level: O3

void aom_highbd_convolve_copy_sse2
               (uint16_t *src,ptrdiff_t src_stride,uint16_t *dst,ptrdiff_t dst_stride,int w,int h)

{
  uint16_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  
  if (w < 0x10) {
    if (w == 2) {
      do {
        *(undefined4 *)dst = *(undefined4 *)src;
        *(undefined4 *)(dst + dst_stride) = *(undefined4 *)(src + src_stride);
        dst = dst + dst_stride * 2;
        src = src + src_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
    if (w == 4) {
      do {
        uVar2 = *(undefined8 *)(src + src_stride);
        *(undefined8 *)dst = *(undefined8 *)src;
        *(undefined8 *)(dst + dst_stride) = uVar2;
        dst = dst + dst_stride * 2;
        src = src + src_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
    if (w == 8) {
      do {
        uVar2 = *(undefined8 *)(src + 4);
        uVar3 = *(undefined8 *)(src + src_stride);
        uVar4 = *(undefined8 *)(src + src_stride + 4);
        *(undefined8 *)dst = *(undefined8 *)src;
        *(undefined8 *)(dst + 4) = uVar2;
        *(undefined8 *)(dst + dst_stride) = uVar3;
        *(undefined8 *)(dst + dst_stride + 4) = uVar4;
        dst = dst + dst_stride * 2;
        src = src + src_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
  }
  else {
    if (w == 0x10) {
      do {
        uVar2 = *(undefined8 *)src;
        uVar3 = *(undefined8 *)(src + 4);
        uVar4 = *(undefined8 *)(src + 8);
        uVar5 = *(undefined8 *)(src + 0xc);
        uVar6 = *(undefined8 *)(src + src_stride);
        uVar7 = *(undefined8 *)(src + src_stride + 4);
        uVar8 = *(undefined8 *)(src + src_stride + 8);
        uVar9 = *(undefined8 *)(src + src_stride + 8 + 4);
        src = src + src_stride * 2;
        *(undefined8 *)dst = uVar2;
        *(undefined8 *)(dst + 4) = uVar3;
        *(undefined8 *)(dst + 8) = uVar4;
        *(undefined8 *)(dst + 0xc) = uVar5;
        *(undefined8 *)(dst + dst_stride) = uVar6;
        *(undefined8 *)(dst + dst_stride + 4) = uVar7;
        *(undefined8 *)(dst + dst_stride + 8) = uVar8;
        *(undefined8 *)(dst + dst_stride + 8 + 4) = uVar9;
        dst = dst + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
    if (w == 0x20) {
      do {
        uVar2 = *(undefined8 *)src;
        uVar3 = *(undefined8 *)(src + 4);
        uVar4 = *(undefined8 *)(src + 8);
        uVar5 = *(undefined8 *)(src + 0xc);
        uVar6 = *(undefined8 *)(src + 0x10);
        uVar7 = *(undefined8 *)(src + 0x14);
        uVar8 = *(undefined8 *)(src + 0x18);
        uVar9 = *(undefined8 *)(src + 0x1c);
        uVar10 = *(undefined8 *)(src + src_stride);
        uVar11 = *(undefined8 *)(src + src_stride + 4);
        uVar12 = *(undefined8 *)(src + src_stride + 8);
        uVar13 = *(undefined8 *)(src + src_stride + 8 + 4);
        uVar14 = *(undefined8 *)(src + src_stride + 0x10);
        uVar15 = *(undefined8 *)(src + src_stride + 0x10 + 4);
        uVar16 = *(undefined8 *)(src + src_stride + 0x18);
        uVar17 = *(undefined8 *)(src + src_stride + 0x18 + 4);
        src = src + src_stride * 2;
        *(undefined8 *)dst = uVar2;
        *(undefined8 *)(dst + 4) = uVar3;
        *(undefined8 *)(dst + 8) = uVar4;
        *(undefined8 *)(dst + 0xc) = uVar5;
        *(undefined8 *)(dst + 0x10) = uVar6;
        *(undefined8 *)(dst + 0x14) = uVar7;
        *(undefined8 *)(dst + 0x18) = uVar8;
        *(undefined8 *)(dst + 0x1c) = uVar9;
        *(undefined8 *)(dst + dst_stride) = uVar10;
        *(undefined8 *)(dst + dst_stride + 4) = uVar11;
        *(undefined8 *)(dst + dst_stride + 8) = uVar12;
        *(undefined8 *)(dst + dst_stride + 8 + 4) = uVar13;
        *(undefined8 *)(dst + dst_stride + 0x10) = uVar14;
        *(undefined8 *)(dst + dst_stride + 0x10 + 4) = uVar15;
        *(undefined8 *)(dst + dst_stride + 0x18) = uVar16;
        *(undefined8 *)(dst + dst_stride + 0x18 + 4) = uVar17;
        dst = dst + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
    if (w == 0x40) {
      do {
        uVar2 = *(undefined8 *)(src + 4);
        uVar3 = *(undefined8 *)(src + 8);
        uVar4 = *(undefined8 *)(src + 0xc);
        uVar5 = *(undefined8 *)(src + 0x10);
        uVar6 = *(undefined8 *)(src + 0x14);
        uVar7 = *(undefined8 *)(src + 0x18);
        uVar8 = *(undefined8 *)(src + 0x1c);
        uVar9 = *(undefined8 *)(src + 0x20);
        uVar10 = *(undefined8 *)(src + 0x24);
        uVar11 = *(undefined8 *)(src + 0x28);
        uVar12 = *(undefined8 *)(src + 0x2c);
        uVar13 = *(undefined8 *)(src + 0x30);
        uVar14 = *(undefined8 *)(src + 0x34);
        uVar15 = *(undefined8 *)(src + 0x38);
        uVar16 = *(undefined8 *)(src + 0x3c);
        *(undefined8 *)dst = *(undefined8 *)src;
        *(undefined8 *)(dst + 4) = uVar2;
        *(undefined8 *)(dst + 8) = uVar3;
        *(undefined8 *)(dst + 0xc) = uVar4;
        *(undefined8 *)(dst + 0x10) = uVar5;
        *(undefined8 *)(dst + 0x14) = uVar6;
        *(undefined8 *)(dst + 0x18) = uVar7;
        *(undefined8 *)(dst + 0x1c) = uVar8;
        *(undefined8 *)(dst + 0x20) = uVar9;
        *(undefined8 *)(dst + 0x24) = uVar10;
        *(undefined8 *)(dst + 0x28) = uVar11;
        *(undefined8 *)(dst + 0x2c) = uVar12;
        *(undefined8 *)(dst + 0x30) = uVar13;
        *(undefined8 *)(dst + 0x34) = uVar14;
        *(undefined8 *)(dst + 0x38) = uVar15;
        *(undefined8 *)(dst + 0x3c) = uVar16;
        puVar1 = src + src_stride;
        uVar2 = *(undefined8 *)(puVar1 + 4);
        uVar3 = *(undefined8 *)(src + src_stride + 8);
        uVar4 = *(undefined8 *)(src + src_stride + 8 + 4);
        uVar5 = *(undefined8 *)(src + src_stride + 0x10);
        uVar6 = *(undefined8 *)(src + src_stride + 0x10 + 4);
        uVar7 = *(undefined8 *)(src + src_stride + 0x18);
        uVar8 = *(undefined8 *)(src + src_stride + 0x18 + 4);
        uVar9 = *(undefined8 *)(src + src_stride + 0x20);
        uVar10 = *(undefined8 *)(src + src_stride + 0x20 + 4);
        uVar11 = *(undefined8 *)(src + src_stride + 0x28);
        uVar12 = *(undefined8 *)(src + src_stride + 0x28 + 4);
        uVar13 = *(undefined8 *)(src + src_stride + 0x30);
        uVar14 = *(undefined8 *)(src + src_stride + 0x30 + 4);
        uVar15 = *(undefined8 *)(src + src_stride + 0x38);
        uVar16 = *(undefined8 *)(src + src_stride + 0x38 + 4);
        src = src + src_stride * 2;
        *(undefined8 *)(dst + dst_stride) = *(undefined8 *)puVar1;
        *(undefined8 *)(dst + dst_stride + 4) = uVar2;
        *(undefined8 *)(dst + dst_stride + 8) = uVar3;
        *(undefined8 *)(dst + dst_stride + 8 + 4) = uVar4;
        *(undefined8 *)(dst + dst_stride + 0x10) = uVar5;
        *(undefined8 *)(dst + dst_stride + 0x10 + 4) = uVar6;
        *(undefined8 *)(dst + dst_stride + 0x18) = uVar7;
        *(undefined8 *)(dst + dst_stride + 0x18 + 4) = uVar8;
        *(undefined8 *)(dst + dst_stride + 0x20) = uVar9;
        *(undefined8 *)(dst + dst_stride + 0x20 + 4) = uVar10;
        *(undefined8 *)(dst + dst_stride + 0x28) = uVar11;
        *(undefined8 *)(dst + dst_stride + 0x28 + 4) = uVar12;
        *(undefined8 *)(dst + dst_stride + 0x30) = uVar13;
        *(undefined8 *)(dst + dst_stride + 0x30 + 4) = uVar14;
        *(undefined8 *)(dst + dst_stride + 0x38) = uVar15;
        *(undefined8 *)(dst + dst_stride + 0x38 + 4) = uVar16;
        dst = dst + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
  }
  do {
    uVar2 = *(undefined8 *)(src + 4);
    uVar3 = *(undefined8 *)(src + 8);
    uVar4 = *(undefined8 *)(src + 0xc);
    uVar5 = *(undefined8 *)(src + 0x10);
    uVar6 = *(undefined8 *)(src + 0x14);
    uVar7 = *(undefined8 *)(src + 0x18);
    uVar8 = *(undefined8 *)(src + 0x1c);
    uVar9 = *(undefined8 *)(src + 0x20);
    uVar10 = *(undefined8 *)(src + 0x24);
    uVar11 = *(undefined8 *)(src + 0x28);
    uVar12 = *(undefined8 *)(src + 0x2c);
    uVar13 = *(undefined8 *)(src + 0x30);
    uVar14 = *(undefined8 *)(src + 0x34);
    uVar15 = *(undefined8 *)(src + 0x38);
    uVar16 = *(undefined8 *)(src + 0x3c);
    uVar17 = *(undefined8 *)(src + 0x40);
    uVar18 = *(undefined8 *)(src + 0x44);
    uVar19 = *(undefined8 *)(src + 0x48);
    uVar20 = *(undefined8 *)(src + 0x4c);
    uVar21 = *(undefined8 *)(src + 0x50);
    uVar22 = *(undefined8 *)(src + 0x54);
    uVar23 = *(undefined8 *)(src + 0x58);
    uVar24 = *(undefined8 *)(src + 0x5c);
    uVar25 = *(undefined8 *)(src + 0x60);
    uVar26 = *(undefined8 *)(src + 100);
    uVar27 = *(undefined8 *)(src + 0x68);
    uVar28 = *(undefined8 *)(src + 0x6c);
    uVar29 = *(undefined8 *)(src + 0x70);
    uVar30 = *(undefined8 *)(src + 0x74);
    uVar31 = *(undefined8 *)(src + 0x78);
    uVar32 = *(undefined8 *)(src + 0x7c);
    *(undefined8 *)dst = *(undefined8 *)src;
    *(undefined8 *)(dst + 4) = uVar2;
    *(undefined8 *)(dst + 8) = uVar3;
    *(undefined8 *)(dst + 0xc) = uVar4;
    *(undefined8 *)(dst + 0x10) = uVar5;
    *(undefined8 *)(dst + 0x14) = uVar6;
    *(undefined8 *)(dst + 0x18) = uVar7;
    *(undefined8 *)(dst + 0x1c) = uVar8;
    *(undefined8 *)(dst + 0x20) = uVar9;
    *(undefined8 *)(dst + 0x24) = uVar10;
    *(undefined8 *)(dst + 0x28) = uVar11;
    *(undefined8 *)(dst + 0x2c) = uVar12;
    *(undefined8 *)(dst + 0x30) = uVar13;
    *(undefined8 *)(dst + 0x34) = uVar14;
    *(undefined8 *)(dst + 0x38) = uVar15;
    *(undefined8 *)(dst + 0x3c) = uVar16;
    *(undefined8 *)(dst + 0x40) = uVar17;
    *(undefined8 *)(dst + 0x44) = uVar18;
    *(undefined8 *)(dst + 0x48) = uVar19;
    *(undefined8 *)(dst + 0x4c) = uVar20;
    *(undefined8 *)(dst + 0x50) = uVar21;
    *(undefined8 *)(dst + 0x54) = uVar22;
    *(undefined8 *)(dst + 0x58) = uVar23;
    *(undefined8 *)(dst + 0x5c) = uVar24;
    *(undefined8 *)(dst + 0x60) = uVar25;
    *(undefined8 *)(dst + 100) = uVar26;
    *(undefined8 *)(dst + 0x68) = uVar27;
    *(undefined8 *)(dst + 0x6c) = uVar28;
    *(undefined8 *)(dst + 0x70) = uVar29;
    *(undefined8 *)(dst + 0x74) = uVar30;
    *(undefined8 *)(dst + 0x78) = uVar31;
    *(undefined8 *)(dst + 0x7c) = uVar32;
    puVar1 = src + src_stride;
    uVar2 = *(undefined8 *)(puVar1 + 4);
    uVar3 = *(undefined8 *)(src + src_stride + 8);
    uVar4 = *(undefined8 *)(src + src_stride + 8 + 4);
    uVar5 = *(undefined8 *)(src + src_stride + 0x10);
    uVar6 = *(undefined8 *)(src + src_stride + 0x10 + 4);
    uVar7 = *(undefined8 *)(src + src_stride + 0x18);
    uVar8 = *(undefined8 *)(src + src_stride + 0x18 + 4);
    uVar9 = *(undefined8 *)(src + src_stride + 0x20);
    uVar10 = *(undefined8 *)(src + src_stride + 0x20 + 4);
    uVar11 = *(undefined8 *)(src + src_stride + 0x28);
    uVar12 = *(undefined8 *)(src + src_stride + 0x28 + 4);
    uVar13 = *(undefined8 *)(src + src_stride + 0x30);
    uVar14 = *(undefined8 *)(src + src_stride + 0x30 + 4);
    uVar15 = *(undefined8 *)(src + src_stride + 0x38);
    uVar16 = *(undefined8 *)(src + src_stride + 0x38 + 4);
    uVar17 = *(undefined8 *)(src + src_stride + 0x40);
    uVar18 = *(undefined8 *)(src + src_stride + 0x40 + 4);
    uVar19 = *(undefined8 *)(src + src_stride + 0x48);
    uVar20 = *(undefined8 *)(src + src_stride + 0x48 + 4);
    uVar21 = *(undefined8 *)(src + src_stride + 0x50);
    uVar22 = *(undefined8 *)(src + src_stride + 0x50 + 4);
    uVar23 = *(undefined8 *)(src + src_stride + 0x58);
    uVar24 = *(undefined8 *)(src + src_stride + 0x58 + 4);
    uVar25 = *(undefined8 *)(src + src_stride + 0x60);
    uVar26 = *(undefined8 *)(src + src_stride + 0x60 + 4);
    uVar27 = *(undefined8 *)(src + src_stride + 0x68);
    uVar28 = *(undefined8 *)(src + src_stride + 0x68 + 4);
    uVar29 = *(undefined8 *)(src + src_stride + 0x70);
    uVar30 = *(undefined8 *)(src + src_stride + 0x70 + 4);
    uVar31 = *(undefined8 *)(src + src_stride + 0x78);
    uVar32 = *(undefined8 *)(src + src_stride + 0x78 + 4);
    src = src + src_stride * 2;
    *(undefined8 *)(dst + dst_stride) = *(undefined8 *)puVar1;
    *(undefined8 *)(dst + dst_stride + 4) = uVar2;
    *(undefined8 *)(dst + dst_stride + 8) = uVar3;
    *(undefined8 *)(dst + dst_stride + 8 + 4) = uVar4;
    *(undefined8 *)(dst + dst_stride + 0x10) = uVar5;
    *(undefined8 *)(dst + dst_stride + 0x10 + 4) = uVar6;
    *(undefined8 *)(dst + dst_stride + 0x18) = uVar7;
    *(undefined8 *)(dst + dst_stride + 0x18 + 4) = uVar8;
    *(undefined8 *)(dst + dst_stride + 0x20) = uVar9;
    *(undefined8 *)(dst + dst_stride + 0x20 + 4) = uVar10;
    *(undefined8 *)(dst + dst_stride + 0x28) = uVar11;
    *(undefined8 *)(dst + dst_stride + 0x28 + 4) = uVar12;
    *(undefined8 *)(dst + dst_stride + 0x30) = uVar13;
    *(undefined8 *)(dst + dst_stride + 0x30 + 4) = uVar14;
    *(undefined8 *)(dst + dst_stride + 0x38) = uVar15;
    *(undefined8 *)(dst + dst_stride + 0x38 + 4) = uVar16;
    *(undefined8 *)(dst + dst_stride + 0x40) = uVar17;
    *(undefined8 *)(dst + dst_stride + 0x40 + 4) = uVar18;
    *(undefined8 *)(dst + dst_stride + 0x48) = uVar19;
    *(undefined8 *)(dst + dst_stride + 0x48 + 4) = uVar20;
    *(undefined8 *)(dst + dst_stride + 0x50) = uVar21;
    *(undefined8 *)(dst + dst_stride + 0x50 + 4) = uVar22;
    *(undefined8 *)(dst + dst_stride + 0x58) = uVar23;
    *(undefined8 *)(dst + dst_stride + 0x58 + 4) = uVar24;
    *(undefined8 *)(dst + dst_stride + 0x60) = uVar25;
    *(undefined8 *)(dst + dst_stride + 0x60 + 4) = uVar26;
    *(undefined8 *)(dst + dst_stride + 0x68) = uVar27;
    *(undefined8 *)(dst + dst_stride + 0x68 + 4) = uVar28;
    *(undefined8 *)(dst + dst_stride + 0x70) = uVar29;
    *(undefined8 *)(dst + dst_stride + 0x70 + 4) = uVar30;
    *(undefined8 *)(dst + dst_stride + 0x78) = uVar31;
    *(undefined8 *)(dst + dst_stride + 0x78 + 4) = uVar32;
    dst = dst + dst_stride * 2;
    h = h + -2;
  } while (h != 0);
  return;
}

Assistant:

void aom_highbd_convolve_copy_sse2(const uint16_t *src, ptrdiff_t src_stride,
                                   uint16_t *dst, ptrdiff_t dst_stride, int w,
                                   int h) {
  // The w >= 8 cases use _mm_store_si128(), which requires its output address
  // be aligned on a 16-byte boundary.
  if (w >= 8) {
    assert(!((intptr_t)dst % 16));
    assert(!(dst_stride % 8));
  }

  if (w == 2) {
    do {
      __m128i s = _mm_loadl_epi64((__m128i *)src);
      *(int *)dst = _mm_cvtsi128_si32(s);
      src += src_stride;
      dst += dst_stride;
      s = _mm_loadl_epi64((__m128i *)src);
      *(int *)dst = _mm_cvtsi128_si32(s);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 4) {
    do {
      __m128i s[2];
      s[0] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      _mm_storel_epi64((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_storel_epi64((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 8) {
    do {
      __m128i s[2];
      s[0] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      _mm_store_si128((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 16) {
    do {
      __m128i s[4];
      s[0] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[1] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      src += src_stride;
      s[2] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[3] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      src += src_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[0]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[1]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[2]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[3]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 32) {
    do {
      __m128i s[8];
      s[0] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[1] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      s[2] = _mm_loadu_si128((__m128i *)(src + 2 * 8));
      s[3] = _mm_loadu_si128((__m128i *)(src + 3 * 8));
      src += src_stride;
      s[4] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[5] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      s[6] = _mm_loadu_si128((__m128i *)(src + 2 * 8));
      s[7] = _mm_loadu_si128((__m128i *)(src + 3 * 8));
      src += src_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[0]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[1]);
      _mm_store_si128((__m128i *)(dst + 2 * 8), s[2]);
      _mm_store_si128((__m128i *)(dst + 3 * 8), s[3]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[4]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[5]);
      _mm_store_si128((__m128i *)(dst + 2 * 8), s[6]);
      _mm_store_si128((__m128i *)(dst + 3 * 8), s[7]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 64) {
    do {
      highbd_copy_64(src, dst);
      src += src_stride;
      dst += dst_stride;
      highbd_copy_64(src, dst);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else {
    do {
      highbd_copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      highbd_copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  }
}